

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ZmqCommsSS.cpp
# Opt level: O1

void __thiscall helics::zeromq::ZmqCommsSS::~ZmqCommsSS(ZmqCommsSS *this)

{
  ConnectionStatus CVar1;
  
  if ((((this->super_NetworkCommsInterface).super_CommsInterface.requestDisconnect._M_base._M_i & 1U
       ) == 0) &&
     (((this->super_NetworkCommsInterface).super_CommsInterface.disconnecting._M_base._M_i & 1U) ==
      0)) {
    CommsInterface::disconnect((CommsInterface *)this);
  }
  else {
    while ((CVar1 = (this->super_NetworkCommsInterface).super_CommsInterface.rxStatus._M_i,
           CVar1 != TERMINATED && (CVar1 != ERRORED))) {
      sched_yield();
    }
  }
  (this->super_NetworkCommsInterface).super_CommsInterface._vptr_CommsInterface =
       (_func_int **)&PTR__NetworkCommsInterface_00560cb8;
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~_Rb_tree(&(this->super_NetworkCommsInterface).openPorts.hosts._M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_int>_>_>
  ::~_Rb_tree(&(this->super_NetworkCommsInterface).openPorts.nextPorts._M_t);
  std::
  _Rb_tree<std::basic_string_view<char,_std::char_traits<char>_>,_std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>,_std::_Select1st<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>,_std::less<std::basic_string_view<char,_std::char_traits<char>_>_>,_std::allocator<std::pair<const_std::basic_string_view<char,_std::char_traits<char>_>,_std::set<int,_std::less<int>,_std::allocator<int>_>_>_>_>
  ::~_Rb_tree(&(this->super_NetworkCommsInterface).openPorts.usedPort._M_t);
  CommsInterface::~CommsInterface((CommsInterface *)this);
  return;
}

Assistant:

ZmqCommsSS::~ZmqCommsSS()
{
    if (requestDisconnect.load() || disconnecting.load()) {
        auto status = getRxStatus();
        while (status != ConnectionStatus::TERMINATED && status != ConnectionStatus::ERRORED) {
            std::this_thread::yield();
            status = getRxStatus();
        }
    } else {
        disconnect();
    }
}